

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint16_t p;
  typed_value<unsigned_short,_char> *ptVar1;
  char *pcVar2;
  size_type sVar3;
  ostream *this;
  time_t tVar4;
  variable_value *this_00;
  unsigned_short *puVar5;
  type local_340;
  thread local_338;
  thread worker;
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  local_328;
  allocator<char> local_301;
  string local_300;
  undefined1 local_2e0 [8];
  rudp_server server;
  io_service io_service;
  key_type local_1e8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  basic_parsed_options<char> local_1a8;
  variables_map local_180 [8];
  variables_map values;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_170 [150];
  unsigned_short local_da;
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description opts;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"Options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<unsigned_short>();
  local_da = 8000;
  ptVar1 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar1,&local_da);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,(value_semantic *)"port,p",(char *)ptVar1);
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  boost::program_options::variables_map::variables_map(local_180);
  local_1c8.super_function_base.functor._8_8_ = 0;
  local_1c8.super_function_base.functor._16_8_ = 0;
  local_1c8.super_function_base.vtable = (vtable_base *)0x0;
  local_1c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1c8);
  boost::program_options::parse_command_line<char>(&local_1a8,argc,argv,local_98,0,&local_1c8);
  boost::program_options::store((basic_parsed_options *)&local_1a8,local_180,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1a8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"help",(allocator<char> *)((long)&io_service.impl_ + 7));
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_170,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&io_service.impl_ + 7));
  if (sVar3 == 0) {
    tVar4 = time((time_t *)0x0);
    srand((uint)tVar4);
    boost::asio::io_context::io_context
              ((io_context *)
               &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"port",&local_301);
    this_00 = boost::program_options::variables_map::operator[](local_180,&local_300);
    puVar5 = boost::program_options::variable_value::as<unsigned_short>(this_00);
    p = *puVar5;
    std::
    function<void(rudp::rudp_server&,unsigned_int,std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&)>
    ::function<main::__0,void>
              ((function<void(rudp::rudp_server&,unsigned_int,std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&)>
                *)&local_328,(anon_class_1_0_00000001 *)((long)&worker._M_id._M_thread + 7));
    rudp::rudp_server::rudp_server
              ((rudp_server *)local_2e0,
               (io_service *)
               &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count,p,
               &local_328);
    std::
    function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
    ::~function(&local_328);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    local_340.io_service =
         (io_service *)&server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::thread::thread<main::__1,,void>(&local_338,&local_340);
    std::thread::join();
    std::thread::~thread(&local_338);
    rudp::rudp_server::~rudp_server((rudp_server *)local_2e0);
    boost::asio::io_context::~io_context
              ((io_context *)
               &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  io_service.impl_._1_3_ = 0;
  io_service.impl_._0_1_ = sVar3 != 0;
  boost::program_options::variables_map::~variables_map(local_180);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "port,p", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  rudp::rudp_server server( io_service, values[ "port" ].as< uint16_t >(),
    []( rudp::rudp_server &self, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( auto &buf: *bufs ) {
        if( buf->size() >= 2 ) {
          const auto header_size = (*buf)[ 1 ];
          if( size_t( header_size ) < buf->size() )
            self.send( ident, std::next( buf->data(), header_size ), std::next( buf->data(), buf->size() ), []( bool status ) {
	      if( status ) { std::cout << "responded" << std::endl; } else { std::cout << "failed" << std::endl; }
	    } );
        }
      }
    }
  );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}